

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactor<double>::vSolveLeft
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn)

{
  long in_RDI;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000040;
  int in_stack_00000044;
  int *in_stack_00000048;
  CLUFactor<double> *in_stack_00000050;
  int *in_stack_00000058;
  double *in_stack_00000060;
  double in_stack_00000068;
  CLUFactor<double> *in_stack_00000070;
  undefined4 local_3c;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0xa0) == 0) {
    solveUpdateLeft((CLUFactor<double> *)CONCAT44(in_stack_00000044,in_stack_00000040),(double)this,
                    (double *)eps,(int *)vec,idx._4_4_);
    local_3c = solveUleft(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                          (double *)in_stack_00000050,in_stack_00000048,in_stack_00000044);
  }
  else {
    solveUleft(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
               (double *)in_stack_00000050,in_stack_00000048,in_stack_00000044);
    local_3c = solveLleftForest((CLUFactor<double> *)CONCAT44(in_stack_00000044,in_stack_00000040),
                                (double)this,(double *)eps,(int *)vec,idx._4_4_);
  }
  if ((double)(local_3c + *(int *)(in_RDI + 0x84)) <= (double)*(int *)(in_RDI + 4) * 0.1) {
    local_4 = solveLleft(in_stack_00000050,(double)in_stack_00000048,
                         (double *)CONCAT44(in_stack_00000044,in_stack_00000040),(int *)this,
                         eps._4_4_);
  }
  else {
    solveLleftNoNZ((CLUFactor<double> *)ridx,(double *)CONCAT44(rn,in_stack_00000008));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CLUFactor<R>::vSolveLeft(R eps,
                             R* vec, int* idx,                       /* result */
                             R* rhs, int* ridx, int rn)            /* rhs    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
   }

   // TODO verify the correctness of this check
   if(rn + l.firstUpdate > verySparseFactor4left * thedim)
   {
      // perform the dense solve
      solveLleftNoNZ(vec);
      // signal the caller that the nonzero pattern is lost
      return 0;
   }
   else
      return solveLleft(eps, vec, idx, rn);
}